

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::~cmSourceFile(cmSourceFile *this)

{
  cmSourceFile *this_local;
  
  SetCustomCommand(this,(cmCustomCommand *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Depends);
  std::__cxx11::string::~string((string *)&this->ObjectLibrary);
  std::__cxx11::string::~string((string *)&this->FullPath);
  std::__cxx11::string::~string((string *)&this->Language);
  std::__cxx11::string::~string((string *)&this->Extension);
  cmPropertyMap::~cmPropertyMap(&this->Properties);
  cmSourceFileLocation::~cmSourceFileLocation(&this->Location);
  return;
}

Assistant:

cmSourceFile::~cmSourceFile()
{
  this->SetCustomCommand(CM_NULLPTR);
}